

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket-rpc.c++
# Opt level: O0

Promise<kj::Maybe<capnp::MessageReaderAndFds>_> __thiscall
capnp::WebSocketMessageStream::tryReadMessage
          (WebSocketMessageStream *this,ArrayPtr<kj::OwnFd> fdSpace,ReaderOptions options,
          ArrayPtr<capnp::word> scratchSpace)

{
  undefined1 local_40 [16];
  WebSocketMessageStream *this_local;
  ReaderOptions options_local;
  ArrayPtr<kj::OwnFd> fdSpace_local;
  
  options_local._8_8_ = fdSpace.size_;
  local_40._8_8_ = fdSpace.ptr;
  this_local = options._8_8_;
  (**(code **)(**(long **)(local_40._8_8_ + 8) + 0x30))
            ((Type *)local_40,*(long **)(local_40._8_8_ + 8),(long)this_local << 3);
  kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>::
  then<capnp::WebSocketMessageStream::tryReadMessage(kj::ArrayPtr<kj::OwnFd>,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::__0>
            ((Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>> *)this,
             (Type *)local_40);
  kj::Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::~Promise
            ((Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
             local_40);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<MessageReaderAndFds>> WebSocketMessageStream::tryReadMessage(
    kj::ArrayPtr<kj::OwnFd> fdSpace,
    ReaderOptions options, kj::ArrayPtr<word> scratchSpace) {
  return socket.receive(options.traversalLimitInWords * sizeof(word))
      .then([options](auto msg) -> kj::Promise<kj::Maybe<MessageReaderAndFds>> {
    KJ_SWITCH_ONEOF(msg) {
        KJ_CASE_ONEOF(closeMsg, kj::WebSocket::Close) {
          return kj::Maybe<MessageReaderAndFds>();
        }
        KJ_CASE_ONEOF(str, kj::String) {
          KJ_FAIL_REQUIRE(
              "Unexpected websocket text message; expected only binary messages.");
          break;
        }
        KJ_CASE_ONEOF(bytes, kj::Array<byte>) {
          kj::Own<capnp::MessageReader> reader;
          size_t sizeInWords = bytes.size() / sizeof(word);
          if (reinterpret_cast<uintptr_t>(bytes.begin()) % alignof(word) == 0) {
            reader = kj::heap<FlatArrayMessageReader>(
                kj::arrayPtr(
                  reinterpret_cast<word *>(bytes.begin()),
                  sizeInWords
                ),
                options).attach(kj::mv(bytes));
          } else {
            // The array is misaligned, so we need to copy it.
            auto words = kj::heapArray<word>(sizeInWords);

            // Note: can't just use bytes.size(), since the the target buffer may
            // be shorter due to integer division.
            memcpy(words.begin(), bytes.begin(), sizeInWords * sizeof(word));
            reader = kj::heap<FlatArrayMessageReader>(
                kj::arrayPtr(words.begin(), sizeInWords),
                options).attach(kj::mv(words));
          }
          return kj::Maybe<MessageReaderAndFds>(MessageReaderAndFds {
            kj::mv(reader),
            nullptr
          });
        }
      }
      KJ_UNREACHABLE;
    });
}